

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.cpp
# Opt level: O3

int __thiscall zmq::ctx_t::shutdown(ctx_t *this,int __fd,int __how)

{
  long lVar1;
  long lVar2;
  scoped_lock_t locker;
  scoped_lock_t local_20;
  
  scoped_lock_t::scoped_lock_t(&local_20,&this->_slot_sync);
  if ((this->_terminating == false) && (this->_terminating = true, this->_starting == false)) {
    lVar1 = (long)(this->_sockets)._items.
                  super__Vector_base<zmq::socket_base_t_*,_std::allocator<zmq::socket_base_t_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->_sockets)._items.
                  super__Vector_base<zmq::socket_base_t_*,_std::allocator<zmq::socket_base_t_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (lVar1 != 0) {
      lVar2 = 0;
      do {
        socket_base_t::stop((this->_sockets)._items.
                            super__Vector_base<zmq::socket_base_t_*,_std::allocator<zmq::socket_base_t_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar2]);
        lVar2 = lVar2 + 1;
      } while (lVar1 >> 3 != lVar2);
      if ((this->_sockets)._items.
          super__Vector_base<zmq::socket_base_t_*,_std::allocator<zmq::socket_base_t_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (this->_sockets)._items.
          super__Vector_base<zmq::socket_base_t_*,_std::allocator<zmq::socket_base_t_*>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_00175924;
    }
    reaper_t::stop(this->_reaper);
  }
LAB_00175924:
  scoped_lock_t::~scoped_lock_t(&local_20);
  return 0;
}

Assistant:

int zmq::ctx_t::shutdown ()
{
    scoped_lock_t locker (_slot_sync);

    if (!_terminating) {
        _terminating = true;

        if (!_starting) {
            //  Send stop command to sockets so that any blocking calls
            //  can be interrupted. If there are no sockets we can ask reaper
            //  thread to stop.
            for (sockets_t::size_type i = 0, size = _sockets.size (); i != size;
                 i++) {
                _sockets[i]->stop ();
            }
            if (_sockets.empty ())
                _reaper->stop ();
        }
    }

    return 0;
}